

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::toString_abi_cxx11_(string *__return_storage_ptr__,Catch *this,char *value)

{
  allocator<char> local_31;
  string local_30;
  
  if (this == (Catch *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"{null string}",(allocator<char> *)&local_30);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,(char *)this,&local_31);
    toString(__return_storage_ptr__,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string toString( const char* const value ) {
    return value ? Catch::toString( std::string( value ) ) : std::string( "{null string}" );
}